

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O1

bool __thiscall QHttpMultiPartIODevice::isSequential(QHttpMultiPartIODevice *this)

{
  QIODevice *pQVar1;
  ulong uVar2;
  char cVar3;
  QHttpMultiPartPrivate *pQVar4;
  ulong uVar5;
  bool bVar6;
  
  pQVar4 = this->multiPart;
  bVar6 = (pQVar4->parts).d.size != 0;
  if (bVar6) {
    uVar5 = 0;
    do {
      pQVar1 = ((pQVar4->parts).d.ptr[uVar5].d.d.ptr)->bodyDevice;
      if ((pQVar1 != (QIODevice *)0x0) &&
         (cVar3 = (**(code **)(*(long *)pQVar1 + 0x60))(), cVar3 != '\0')) {
        return bVar6;
      }
      uVar5 = uVar5 + 1;
      pQVar4 = this->multiPart;
      uVar2 = (pQVar4->parts).d.size;
      bVar6 = uVar5 < uVar2;
    } while (uVar5 < uVar2);
  }
  return bVar6;
}

Assistant:

bool QHttpMultiPartIODevice::isSequential() const
{
    for (int a = 0; a < multiPart->parts.size(); a++) {
        QIODevice *device = multiPart->parts.at(a).d->bodyDevice;
        // we are sequential if any of the bodyDevices of our parts are sequential;
        // when reading from a byte array, we are not sequential
        if (device && device->isSequential())
            return true;
    }
    return false;
}